

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_index_tests.cpp
# Opt level: O2

CBlock * __thiscall
blockfilter_index_tests::BuildChainTestingSetup::CreateBlock
          (CBlock *__return_storage_ptr__,BuildChainTestingSetup *this,CBlockIndex *prev,
          vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *txns,
          CScript *scriptPubKey)

{
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
  *this_00;
  long lVar1;
  pointer pCVar2;
  uint256 hash;
  bool bVar3;
  Chainstate *chainstate;
  reference pvVar4;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  reference pvVar5;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pCVar6;
  long in_FS_OFFSET;
  unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_> pblocktemplate;
  Options options;
  __buckets_ptr local_148;
  size_type sStack_140;
  __node_base local_138;
  size_type sStack_130;
  undefined1 local_128 [24];
  pointer pCStack_110;
  CMutableTransaction tx_coinbase;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  options.super_BlockCreateOptions.use_mempool = true;
  options.super_BlockCreateOptions.coinbase_max_additional_weight = 4000;
  options.super_BlockCreateOptions.coinbase_output_max_additional_sigops = 400;
  options.nBlockMaxWeight = 0x3cf960;
  options.blockMinFeeRate.nSatoshisPerK = 1000;
  options.test_block_validity = true;
  options.print_modified_fee = false;
  chainstate = ChainstateManager::ActiveChainstate
                         ((this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup
                          .super_BasicTestingSetup.m_node.chainman._M_t.
                          super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                          .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ::node::BlockAssembler::BlockAssembler
            ((BlockAssembler *)&tx_coinbase,chainstate,
             (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.mempool._M_t.
             super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
             super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
             super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&options);
  ::node::BlockAssembler::CreateNewBlock((BlockAssembler *)&pblocktemplate,(CScript *)&tx_coinbase);
  ::node::BlockAssembler::~BlockAssembler((BlockAssembler *)&tx_coinbase);
  CBlockIndex::GetBlockHash((uint256 *)&tx_coinbase,prev);
  *(pointer *)
   ((long)pblocktemplate._M_t.
          super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>.
          _M_t.
          super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
          .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl + 0x14) =
       tx_coinbase.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  *(pointer *)
   ((long)pblocktemplate._M_t.
          super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>.
          _M_t.
          super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
          .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl + 0x1c) =
       tx_coinbase.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)pblocktemplate._M_t.
          super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>.
          _M_t.
          super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
          .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl + 4) =
       tx_coinbase.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)pblocktemplate._M_t.
          super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>.
          _M_t.
          super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
          .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl + 0xc) =
       tx_coinbase.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(uint32_t *)
   ((long)pblocktemplate._M_t.
          super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>.
          _M_t.
          super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
          .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl + 0x44) =
       prev->nTime + 1;
  this_00 = (vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
             *)((long)pblocktemplate._M_t.
                      super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                      .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl + 0x50);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::resize((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)this_00,1);
  pCVar2 = (txns->super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pCVar6 = (txns->super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>
                )._M_impl.super__Vector_impl_data._M_start; pCVar6 != pCVar2; pCVar6 = pCVar6 + 1) {
    std::make_shared<CTransaction_const,CMutableTransaction_const&>(&tx_coinbase);
    std::
    vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
    ::emplace_back<std::shared_ptr<CTransaction_const>>
              (this_00,(shared_ptr<const_CTransaction> *)&tx_coinbase);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &tx_coinbase.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish);
  }
  pvVar4 = std::
           vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ::at((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)this_00,0);
  CMutableTransaction::CMutableTransaction
            (&tx_coinbase,
             (pvVar4->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  local_128._16_8_ = (__node_base_ptr)0x0;
  pCStack_110 = (pointer)0x0;
  local_128._0_8_ = (char *)0x0;
  local_128._8_8_ = 0;
  other = &CScript::push_int64((CScript *)local_128,(long)prev->nHeight + 1)->super_CScriptBase;
  pvVar5 = std::vector<CTxIn,_std::allocator<CTxIn>_>::at(&tx_coinbase.vin,0);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&(pvVar5->scriptSig).super_CScriptBase,other);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_128);
  std::make_shared<CTransaction_const,CMutableTransaction>((CMutableTransaction *)local_128);
  this_01 = &std::
             vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ::at((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   *)this_00,0)->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (this_01,(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
  BlockMerkleRoot((uint256 *)local_128,
                  (CBlock *)
                  pblocktemplate._M_t.
                  super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                  .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl,(bool *)0x0);
  *(undefined8 *)
   ((long)pblocktemplate._M_t.
          super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>.
          _M_t.
          super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
          .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl + 0x34) =
       local_128._16_8_;
  *(pointer *)
   ((long)pblocktemplate._M_t.
          super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>.
          _M_t.
          super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
          .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl + 0x3c) = pCStack_110;
  *(undefined8 *)
   ((long)pblocktemplate._M_t.
          super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>.
          _M_t.
          super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
          .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl + 0x24) =
       local_128._0_8_;
  *(undefined8 *)
   ((long)pblocktemplate._M_t.
          super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>.
          _M_t.
          super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
          .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl + 0x2c) =
       local_128._8_8_;
  CMutableTransaction::~CMutableTransaction(&tx_coinbase);
  while( true ) {
    CBlockHeader::GetHash
              ((uint256 *)&local_148,
               (CBlockHeader *)
               pblocktemplate._M_t.
               super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
               ._M_t.
               super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
               .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl);
    hash.super_base_blob<256U>.m_data._M_elems[8] = (undefined1)sStack_140;
    hash.super_base_blob<256U>.m_data._M_elems[9] = sStack_140._1_1_;
    hash.super_base_blob<256U>.m_data._M_elems[10] = sStack_140._2_1_;
    hash.super_base_blob<256U>.m_data._M_elems[0xb] = sStack_140._3_1_;
    hash.super_base_blob<256U>.m_data._M_elems[0xc] = sStack_140._4_1_;
    hash.super_base_blob<256U>.m_data._M_elems[0xd] = sStack_140._5_1_;
    hash.super_base_blob<256U>.m_data._M_elems[0xe] = sStack_140._6_1_;
    hash.super_base_blob<256U>.m_data._M_elems[0xf] = sStack_140._7_1_;
    hash.super_base_blob<256U>.m_data._M_elems._0_8_ = local_148;
    hash.super_base_blob<256U>.m_data._M_elems._16_8_ = local_138._M_nxt;
    hash.super_base_blob<256U>.m_data._M_elems[0x18] = (undefined1)sStack_130;
    hash.super_base_blob<256U>.m_data._M_elems[0x19] = sStack_130._1_1_;
    hash.super_base_blob<256U>.m_data._M_elems[0x1a] = sStack_130._2_1_;
    hash.super_base_blob<256U>.m_data._M_elems[0x1b] = sStack_130._3_1_;
    hash.super_base_blob<256U>.m_data._M_elems[0x1c] = sStack_130._4_1_;
    hash.super_base_blob<256U>.m_data._M_elems[0x1d] = sStack_130._5_1_;
    hash.super_base_blob<256U>.m_data._M_elems[0x1e] = sStack_130._6_1_;
    hash.super_base_blob<256U>.m_data._M_elems[0x1f] = sStack_130._7_1_;
    bVar3 = CheckProofOfWork(hash,*(uint *)((long)pblocktemplate._M_t.
                                                  super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                                                  .
                                                  super__Head_base<0UL,_node::CBlockTemplate_*,_false>
                                                  ._M_head_impl + 0x48),
                             &((((this->super_TestChain100Setup).super_TestingSetup.
                                 super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman.
                                 _M_t.
                                 super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                                 .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->
                               m_options).chainparams)->consensus);
    if (bVar3) break;
    *(int *)((long)pblocktemplate._M_t.
                   super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                   .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl + 0x4c) =
         *(int *)((long)pblocktemplate._M_t.
                        super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                        .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl + 0x4c) +
         1;
  }
  CBlock::CBlock(__return_storage_ptr__,
                 (CBlock *)
                 pblocktemplate._M_t.
                 super___uniq_ptr_impl<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_node::CBlockTemplate_*,_std::default_delete<node::CBlockTemplate>_>
                 .super__Head_base<0UL,_node::CBlockTemplate_*,_false>._M_head_impl);
  std::unique_ptr<node::CBlockTemplate,_std::default_delete<node::CBlockTemplate>_>::~unique_ptr
            (&pblocktemplate);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CBlock BuildChainTestingSetup::CreateBlock(const CBlockIndex* prev,
    const std::vector<CMutableTransaction>& txns,
    const CScript& scriptPubKey)
{
     BlockAssembler::Options options;
    std::unique_ptr<CBlockTemplate> pblocktemplate = BlockAssembler{m_node.chainman->ActiveChainstate(), m_node.mempool.get(), options}.CreateNewBlock(scriptPubKey);
    CBlock& block = pblocktemplate->block;
    block.hashPrevBlock = prev->GetBlockHash();
    block.nTime = prev->nTime + 1;

    // Replace mempool-selected txns with just coinbase plus passed-in txns:
    block.vtx.resize(1);
    for (const CMutableTransaction& tx : txns) {
        block.vtx.push_back(MakeTransactionRef(tx));
    }
    {
        CMutableTransaction tx_coinbase{*block.vtx.at(0)};
        tx_coinbase.vin.at(0).scriptSig = CScript{} << prev->nHeight + 1;
        block.vtx.at(0) = MakeTransactionRef(std::move(tx_coinbase));
        block.hashMerkleRoot = BlockMerkleRoot(block);
    }

    while (!CheckProofOfWork(block.GetHash(), block.nBits, m_node.chainman->GetConsensus())) ++block.nNonce;

    return block;
}